

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  buffer<char> *extraout_RAX;
  basic_format_specs<char> *in_R8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> this_00;
  basic_string_view<char> s;
  
  if (this->specs_ == (format_specs *)0x0) {
    pcVar1 = "false";
    if ((char)__fd != '\0') {
      pcVar1 = "true";
    }
    this_00.container =
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    buffer<char>::append<char>(this_00.container,pcVar1,pcVar1 + ((ulong)(uint)__fd & 0xff ^ 5));
    bVar2.container = extraout_RAX;
  }
  else {
    pcVar1 = "false";
    if ((char)__fd != '\0') {
      pcVar1 = "true";
    }
    s.data_ = (char *)((ulong)(uint)__fd & 0xff ^ 5);
    s.size_ = (size_t)this->specs_;
    bVar2.container =
         (buffer<char> *)
         write<char,char,fmt::v7::detail::buffer_appender<char>>
                   ((this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                    container,(buffer_appender<char>)pcVar1,s,in_R8);
    this_00.container = bVar2.container;
  }
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       this_00.container;
  return (ssize_t)bVar2.container;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }